

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall
QGraphicsPathItem::paint
          (QGraphicsPathItem *this,QPainter *painter,QStyleOptionGraphicsItem *option,
          QWidget *widget)

{
  Int IVar1;
  QPen *in_RSI;
  QFlags<QStyle::StateFlag> *in_RDI;
  long in_FS_OFFSET;
  QGraphicsPathItemPrivate *d;
  StateFlag in_stack_ffffffffffffffbc;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QGraphicsPathItem *)0x9884d9);
  QPainter::setPen(in_RSI);
  QPainter::setBrush((QBrush *)in_RSI);
  QPainter::drawPath((QPainterPath *)in_RSI);
  local_c.super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorage<QStyle::StateFlag>)
       QFlags<QStyle::StateFlag>::operator&(in_RDI,in_stack_ffffffffffffffbc);
  IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_c);
  if (IVar1 != 0) {
    qt_graphicsItem_highlightSelected
              ((QGraphicsItem *)option,(QPainter *)widget,(QStyleOptionGraphicsItem *)d);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsPathItem::paint(QPainter *painter, const QStyleOptionGraphicsItem *option,
                              QWidget *widget)
{
    Q_D(QGraphicsPathItem);
    Q_UNUSED(widget);
    painter->setPen(d->pen);
    painter->setBrush(d->brush);
    painter->drawPath(d->path);

    if (option->state & QStyle::State_Selected)
        qt_graphicsItem_highlightSelected(this, painter, option);
}